

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSSLDSAPublicKey.cpp
# Opt level: O2

void __thiscall OSSLDSAPublicKey::~OSSLDSAPublicKey(OSSLDSAPublicKey *this)

{
  *(undefined ***)&this->super_DSAPublicKey = &PTR_serialise_0019d658;
  DSA_free((DSA *)this->dsa);
  DSAPublicKey::~DSAPublicKey(&this->super_DSAPublicKey);
  return;
}

Assistant:

OSSLDSAPublicKey::~OSSLDSAPublicKey()
{
	DSA_free(dsa);
}